

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReliablePdu.cpp
# Opt level: O3

int __thiscall DIS::DataReliablePdu::getMarshalledSize(DataReliablePdu *this)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  pointer pFVar4;
  pointer pVVar5;
  long lVar6;
  ulong uVar7;
  FixedDatum listElement;
  VariableDatum local_60;
  
  iVar2 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  iVar2 = iVar2 + 0x10;
  pFVar4 = (this->_fixedDatumRecords).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatumRecords).
      super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar4) {
    lVar6 = 8;
    uVar7 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__FixedDatum_001b4c68;
      local_60._8_8_ = *(undefined8 *)((long)&pFVar4->_vptr_FixedDatum + lVar6);
      iVar3 = FixedDatum::getMarshalledSize((FixedDatum *)&local_60);
      iVar2 = iVar2 + iVar3;
      FixedDatum::~FixedDatum((FixedDatum *)&local_60);
      uVar7 = uVar7 + 1;
      pFVar4 = (this->_fixedDatumRecords).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < (ulong)((long)(this->_fixedDatumRecords).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 4));
  }
  pVVar5 = (this->_variableDatumRecords).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatumRecords).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar5) {
    lVar6 = 0x18;
    uVar7 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__VariableDatum_001b6628;
      puVar1 = (undefined8 *)((long)pVVar5 + lVar6 + -0x10);
      local_60._8_8_ = *puVar1;
      local_60._16_8_ = puVar1[1];
      std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::vector
                (&local_60._variableDatums,
                 (vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_> *)
                 ((long)&pVVar5->_vptr_VariableDatum + lVar6));
      iVar3 = VariableDatum::getMarshalledSize(&local_60);
      iVar2 = iVar2 + iVar3;
      VariableDatum::~VariableDatum(&local_60);
      uVar7 = uVar7 + 1;
      pVVar5 = (this->_variableDatumRecords).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x30;
    } while (uVar7 < (ulong)(((long)(this->_variableDatumRecords).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4)
                            * -0x5555555555555555));
  }
  return iVar2;
}

Assistant:

int DataReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 1;  // _requiredReliabilityService
   marshalSize = marshalSize + 2;  // _pad1
   marshalSize = marshalSize + 1;  // _pad2
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatumRecords.size(); idx++)
   {
        FixedDatum listElement = _fixedDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatumRecords.size(); idx++)
   {
        VariableDatum listElement = _variableDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}